

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1207e7f::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  string *psVar2;
  Value *pVVar3;
  Value local_3c8;
  undefined1 local_3a0 [8];
  Value compileGroups;
  Value sourceGroups;
  Value folder;
  undefined1 local_300 [8];
  pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  fileSetInfo;
  Value dependencies;
  Value launchers;
  string local_230;
  Value local_210;
  Value local_1e8;
  string local_1c0;
  Value local_1a0;
  undefined1 local_178 [8];
  Value artifacts;
  undefined1 local_128 [56];
  Value local_f0;
  string local_c8;
  Value local_a8;
  Value local_80;
  Value local_58;
  _Rb_tree_color local_20;
  byte local_19;
  TargetType type;
  Target *this_local;
  Value *target;
  
  local_19 = 0;
  _type = this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_20 = cmGeneratorTarget::GetType(this->GT);
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&local_58,psVar2);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar3,&local_58);
  Json::Value::~Value(&local_58);
  psVar2 = cmState::GetTargetTypeName_abi_cxx11_(local_20);
  Json::Value::Value(&local_80,psVar2);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar3,&local_80);
  Json::Value::~Value(&local_80);
  TargetId(&local_c8,this->GT,&this->TopBuild);
  Json::Value::Value(&local_a8,&local_c8);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar3,&local_a8);
  Json::Value::~Value(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  DumpPaths(&local_f0,this);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar3,&local_f0);
  Json::Value::~Value(&local_f0);
  bVar1 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar1) {
    Json::Value::Value((Value *)(local_128 + 0x10),true);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar3,(Value *)(local_128 + 0x10));
    Json::Value::~Value((Value *)(local_128 + 0x10));
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_128);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)local_128);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_128);
  bVar1 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar1) {
    DumpInstall((Value *)&artifacts.limit_,this);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar3,(Value *)&artifacts.limit_);
    Json::Value::~Value((Value *)&artifacts.limit_);
  }
  bVar1 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar1) {
    DumpArtifacts((Value *)local_178,this);
    bVar1 = Json::Value::empty((Value *)local_178);
    if (!bVar1) {
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar3,(Value *)local_178);
    }
    Json::Value::~Value((Value *)local_178);
  }
  if (((local_20 == _S_red) || (local_20 == 2)) || (local_20 == 3)) {
    cmGeneratorTarget::GetFullName(&local_1c0,this->GT,this->Config,RuntimeBinaryArtifact);
    Json::Value::Value(&local_1a0,&local_1c0);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar3,&local_1a0);
    Json::Value::~Value(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    DumpLink(&local_1e8,this);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"link");
    Json::Value::operator=(pVVar3,&local_1e8);
    Json::Value::~Value(&local_1e8);
  }
  else if (local_20 == _S_black) {
    cmGeneratorTarget::GetFullName(&local_230,this->GT,this->Config,RuntimeBinaryArtifact);
    Json::Value::Value(&local_210,&local_230);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar3,&local_210);
    Json::Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    DumpArchive((Value *)&launchers.limit_,this);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"archive");
    Json::Value::operator=(pVVar3,(Value *)&launchers.limit_);
    Json::Value::~Value((Value *)&launchers.limit_);
  }
  if (local_20 == _S_red) {
    DumpLaunchers((Value *)&dependencies.limit_,this);
    bVar1 = Json::Value::empty((Value *)&dependencies.limit_);
    if (!bVar1) {
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,"launchers");
      Json::Value::operator=(pVVar3,(Value *)&dependencies.limit_);
    }
    Json::Value::~Value((Value *)&dependencies.limit_);
  }
  DumpDependencies((Value *)&fileSetInfo.second._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   this);
  bVar1 = Json::Value::empty((Value *)&fileSetInfo.second._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
  if (!bVar1) {
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=
              (pVVar3,(Value *)&fileSetInfo.second._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
  }
  ProcessLanguages(this);
  (anonymous_namespace)::Target::DumpFileSets_abi_cxx11_
            ((pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
              *)local_300,this);
  bVar1 = Json::Value::isNull((Value *)local_300);
  if (!bVar1) {
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"fileSets");
    Json::Value::operator=(pVVar3,(Value *)local_300);
  }
  DumpSources((Value *)&folder.limit_,this,(FileSetDatabase *)&fileSetInfo.first.limit_);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sources");
  Json::Value::operator=(pVVar3,(Value *)&folder.limit_);
  Json::Value::~Value((Value *)&folder.limit_);
  DumpFolder((Value *)&sourceGroups.limit_,this);
  bVar1 = Json::Value::isNull((Value *)&sourceGroups.limit_);
  if (!bVar1) {
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"folder");
    Json::Value::operator=(pVVar3,(Value *)&sourceGroups.limit_);
  }
  DumpSourceGroups((Value *)&compileGroups.limit_,this);
  bVar1 = Json::Value::empty((Value *)&compileGroups.limit_);
  if (!bVar1) {
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
    Json::Value::operator=(pVVar3,(Value *)&compileGroups.limit_);
  }
  DumpCompileGroups((Value *)local_3a0,this);
  bVar1 = Json::Value::empty((Value *)local_3a0);
  if (!bVar1) {
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
    Json::Value::operator=(pVVar3,(Value *)local_3a0);
  }
  Json::Value::~Value((Value *)local_3a0);
  Json::Value::~Value((Value *)&compileGroups.limit_);
  Json::Value::~Value((Value *)&sourceGroups.limit_);
  std::
  pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~pair((pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
           *)local_300);
  BacktraceData::Dump(&local_3c8,&this->Backtraces);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
  Json::Value::operator=(pVVar3,&local_3c8);
  Json::Value::~Value(&local_3c8);
  local_19 = 1;
  Json::Value::~Value((Value *)&fileSetInfo.second._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  if ((local_19 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  if (type == cmStateEnums::EXECUTABLE) {
    Json::Value launchers = this->DumpLaunchers();
    if (!launchers.empty()) {
      target["launchers"] = std::move(launchers);
    }
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    auto fileSetInfo = this->DumpFileSets();

    if (!fileSetInfo.first.isNull()) {
      target["fileSets"] = fileSetInfo.first;
    }

    target["sources"] = this->DumpSources(fileSetInfo.second);

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}